

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_DRAGON(effect_handler_context_t_conflict *context)

{
  effect *effect;
  _Bool _Var1;
  source sVar2;
  source origin;
  source origin_00;
  wchar_t local_28;
  _Bool local_21;
  wchar_t dir;
  _Bool ident;
  player_shape *shape;
  effect_handler_context_t_conflict *context_local;
  
  shape = (player_shape *)context;
  _dir = player_shape_by_idx(context->subtype);
  local_21 = false;
  local_28 = L'\x05';
  if (_dir != (player_shape *)0x0) {
    _Var1 = player_is_shapechanged(player);
    if (_Var1) {
      get_aim_dir(&local_28);
      player_confuse_dir(player,&local_28,false);
      effect = _dir->breath->effect;
      sVar2 = source_player();
      origin_00.which = sVar2.which;
      origin_00._4_4_ = 0;
      origin_00.what = sVar2.what;
      context_local._7_1_ =
           effect_do(effect,origin_00,(object *)0x0,&local_21,true,local_28,L'\0',L'\0',
                     (command_conflict *)0x0);
    }
    else {
      sVar2 = source_none();
      origin.which = sVar2.which;
      origin._4_4_ = 0;
      origin.what = sVar2.what;
      effect_simple(L'k',origin,"0",shape->skills[8],L'\0',L'\0',L'\0',L'\0',&local_21);
      context_local._7_1_ = true;
    }
    return context_local._7_1_;
  }
  __assert_fail("shape",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/effect-handler-general.c"
                ,0xeef,"_Bool effect_handler_DRAGON(effect_handler_context_t *)");
}

Assistant:

bool effect_handler_DRAGON(effect_handler_context_t *context)
{
	struct player_shape *shape = player_shape_by_idx(context->subtype);
	bool ident = false;
	int dir = DIR_TARGET;

	assert(shape);

	/* Change shape... */
	if (!player_is_shapechanged(player)) {
		effect_simple(EF_SHAPECHANGE, source_none(), "0", context->subtype, 0,
					  0, 0, 0, &ident);
	} else {
		/* ...or breathe */
		get_aim_dir(&dir);
		player_confuse_dir(player, &dir, false);
		return effect_do(shape->breath->effect, source_player(), NULL, &ident,
						 true, dir, 0, 0, NULL);
	}

	return true;
}